

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralExpressions.cpp
# Opt level: O0

void __thiscall
slang::ast::IntegerLiteral::serializeTo(IntegerLiteral *this,ASTSerializer *serializer)

{
  undefined1 local_60 [56];
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_28;
  void *local_20;
  ASTSerializer *local_18;
  ASTSerializer *serializer_local;
  IntegerLiteral *this_local;
  
  local_18 = serializer;
  serializer_local = (ASTSerializer *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&local_28,"value");
  getValue((IntegerLiteral *)local_60);
  slang::ConstantValue::ConstantValue((ConstantValue *)(local_60 + 0x10),(SVInt *)local_60);
  ASTSerializer::write(serializer,local_28.val._0_4_,local_20,(size_t)(local_60 + 0x10));
  slang::ConstantValue::~ConstantValue((ConstantValue *)(local_60 + 0x10));
  SVInt::~SVInt((SVInt *)local_60);
  return;
}

Assistant:

void IntegerLiteral::serializeTo(ASTSerializer& serializer) const {
    serializer.write("value", getValue());
}